

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void __thiscall SVGChart::PPlot::~PPlot(PPlot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  
  (this->super_PDrawer)._vptr_PDrawer = (_func_int **)&PTR__PPlot_00112720;
  if ((this->mOwnsPPlotDrawer == true) && (this->mPPlotDrawer != (PDrawer *)0x0)) {
    (*this->mPPlotDrawer->_vptr_PDrawer[1])();
  }
  (this->mXNamedTickIterator).super_LinTickIterator.super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__NamedTickIterator_00112a58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->mXNamedTickIterator).mStringList);
  (this->mXNamedTickIterator).super_LinTickIterator.super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__LinTickIterator_001129a8;
  pcVar2 = (this->mXNamedTickIterator).super_LinTickIterator.mFormatString._M_dataplus._M_p;
  paVar1 = &(this->mXNamedTickIterator).super_LinTickIterator.mFormatString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->mYLinTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__LinTickIterator_001129a8;
  pcVar2 = (this->mYLinTickIterator).mFormatString._M_dataplus._M_p;
  paVar1 = &(this->mYLinTickIterator).mFormatString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->mXLinTickIterator).super_TickIterator._vptr_TickIterator =
       (_func_int **)&PTR__LinTickIterator_001129a8;
  pcVar2 = (this->mXLinTickIterator).mFormatString._M_dataplus._M_p;
  paVar1 = &(this->mXLinTickIterator).mFormatString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppPVar3 = (this->mPostDrawerList).
            super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3,(long)(this->mPostDrawerList).
                                  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar3
                   );
  }
  ppPVar3 = (this->mPreDrawerList).
            super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3,(long)(this->mPreDrawerList).
                                  super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar3
                   );
  }
  ppPVar4 = (this->mPostCalculatorList).
            super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4,(long)(this->mPostCalculatorList).
                                  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar4
                   );
  }
  ppPVar4 = (this->mModifyingCalculatorList).
            super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4,(long)(this->mModifyingCalculatorList).
                                  super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar4
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->mPlotBackground).mStyle.mVar._M_t);
  pcVar2 = (this->mPlotBackground).mStyle.mPenStyle._M_dataplus._M_p;
  paVar1 = &(this->mPlotBackground).mStyle.mPenStyle.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mPlotBackground).mStyle.mFont._M_dataplus._M_p;
  paVar1 = &(this->mPlotBackground).mStyle.mFont.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mPlotBackground).mTitle._M_dataplus._M_p;
  paVar1 = &(this->mPlotBackground).mTitle.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  AxisSetup::~AxisSetup(&this->mYAxisSetup);
  AxisSetup::~AxisSetup(&this->mXAxisSetup);
  PlotDataContainer::~PlotDataContainer(&this->mPlotDataContainer);
  return;
}

Assistant:

PPlot::~PPlot () {
      if (mOwnsPPlotDrawer) {
        delete mPPlotDrawer;
      }
    }